

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

uint32_t __thiscall capnp::Schema::getSchemaOffset(Schema *this,Reader *value)

{
  Which WVar1;
  uint uVar2;
  Fault local_a8;
  Fault f;
  Reader local_80;
  Reader local_60;
  ArrayPtr<const_unsigned_char> local_40;
  StringPtr local_30;
  ReaderFor<capnp::_::UncheckedMessage> local_20;
  word *ptr;
  Reader *value_local;
  Schema *this_local;
  
  ptr = (word *)value;
  value_local = (Reader *)this;
  WVar1 = capnp::schema::Value::Reader::which(value);
  uVar2 = WVar1 - 0xc;
  if (uVar2 < 6 || WVar1 == 0x12) {
    switch((long)&switchD_00385ab4::switchdataD_004a4e98 +
           (long)(int)(&switchD_00385ab4::switchdataD_004a4e98)[uVar2]) {
    case 0x385ab6:
      local_30.content = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText((Reader *)ptr);
      local_20 = (ReaderFor<capnp::_::UncheckedMessage>)kj::StringPtr::begin(&local_30);
      break;
    case 0x385ad9:
      local_40 = (ArrayPtr<const_unsigned_char>)capnp::schema::Value::Reader::getData((Reader *)ptr)
      ;
      local_20 = (ReaderFor<capnp::_::UncheckedMessage>)
                 kj::ArrayPtr<const_unsigned_char>::begin(&local_40);
      break;
    case 0x385afc:
      capnp::schema::Value::Reader::getStruct(&local_60,(Reader *)ptr);
      local_20 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_60);
      break;
    case 0x385b1b:
      capnp::schema::Value::Reader::getList(&local_80,(Reader *)ptr);
      local_20 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_80);
      break;
    case 0x385b3a:
      capnp::schema::Value::Reader::getAnyPointer((Reader *)&f,(Reader *)ptr);
      local_20 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>((Reader *)&f);
      break;
    default:
      goto switchD_00385ab4_caseD_385b5c;
    }
    return (uint32_t)((long)local_20 - (long)this->raw->generic->encodedNode >> 3);
  }
switchD_00385ab4_caseD_385b5c:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
            (&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x15e,FAILED,(char *)0x0,
             "\"getDefaultValueSchemaOffset() can only be called on struct, list, \" \"and any-pointer fields.\""
             ,(char (*) [90])
              "getDefaultValueSchemaOffset() can only be called on struct, list, and any-pointer fields."
            );
  kj::_::Debug::Fault::fatal(&local_a8);
}

Assistant:

uint32_t Schema::getSchemaOffset(const schema::Value::Reader& value) const {
  const word* ptr;

  switch (value.which()) {
    case schema::Value::TEXT:
      ptr = reinterpret_cast<const word*>(value.getText().begin());
      break;
    case schema::Value::DATA:
      ptr = reinterpret_cast<const word*>(value.getData().begin());
      break;
    case schema::Value::STRUCT:
      ptr = value.getStruct().getAs<_::UncheckedMessage>();
      break;
    case schema::Value::LIST:
      ptr = value.getList().getAs<_::UncheckedMessage>();
      break;
    case schema::Value::ANY_POINTER:
      ptr = value.getAnyPointer().getAs<_::UncheckedMessage>();
      break;
    default:
      KJ_FAIL_ASSERT("getDefaultValueSchemaOffset() can only be called on struct, list, "
                     "and any-pointer fields.");
  }

  return ptr - raw->generic->encodedNode;
}